

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AY38910.cpp
# Opt level: O1

void __thiscall
GI::AY38910::AY38910SampleSource<false>::update_bus(AY38910SampleSource<false> *this)

{
  ControlState CVar1;
  long lVar2;
  byte bVar3;
  
  this->data_output_ = 0xff;
  CVar1 = this->control_state_;
  if (CVar1 == Write) {
    set_register_value(this,this->data_input_);
    return;
  }
  if (CVar1 == Read) {
    lVar2 = (long)this->selected_register_;
    bVar3 = 0xff;
    if (lVar2 < 0x10) {
      bVar3 = (&DAT_004711f0)[lVar2] & this->registers_[lVar2];
    }
    this->data_output_ = bVar3;
  }
  else if (CVar1 == LatchAddress) {
    this->selected_register_ = (uint)this->data_input_;
    return;
  }
  return;
}

Assistant:

void AY38910SampleSource<is_stereo>::update_bus() {
	// Assume no output, unless this turns out to be a read.
	data_output_ = 0xff;
	switch(control_state_) {
		default:			break;
		case LatchAddress:	select_register(data_input_);			break;
		case Write:			set_register_value(data_input_);		break;
		case Read:			data_output_ = get_register_value();	break;
	}
}